

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  void **ppvVar1;
  uint *puVar2;
  uv_stream_t *puVar3;
  int iVar4;
  uint uVar5;
  uint64_t uVar6;
  uv_stream_t *stream;
  bool bVar7;
  
  if ((((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) &&
      (loop->pending_queue == (void **)loop->pending_queue[0])) &&
     (loop->closing_handles == (uv_handle_t *)0x0)) {
    uVar6 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar6 / 1000000;
    uVar5 = 0;
LAB_00112361:
    if (loop->stop_flag != 0) {
      loop->stop_flag = 0;
    }
    return uVar5;
  }
  ppvVar1 = loop->pending_queue;
LAB_0011216b:
  if (loop->stop_flag == 0) {
    uVar6 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar6 / 1000000;
    uv__run_timers(loop);
    bVar7 = false;
    if (ppvVar1 == (void **)loop->pending_queue[0]) {
      bVar7 = loop->idle_handles == (void **)loop->idle_handles[0];
    }
    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);
    iVar4 = 0;
    if ((mode == UV_RUN_DEFAULT) || ((bool)(mode == UV_RUN_ONCE & bVar7))) {
      iVar4 = uv__backend_timeout(loop);
    }
    uv__io_poll(loop,iVar4);
    iVar4 = 8;
    do {
      if (ppvVar1 == (void **)*ppvVar1) break;
      uv__run_pending(loop);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    uv__metrics_update_idle_time(loop);
    uv__run_check(loop);
    puVar3 = (uv_stream_t *)loop->closing_handles;
    loop->closing_handles = (uv_handle_t *)0x0;
LAB_00112233:
    stream = puVar3;
    if (stream == (uv_stream_t *)0x0) goto LAB_001122f7;
    uVar5 = stream->flags;
    if ((uVar5 & 1) == 0) {
      __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                    ,0x10e,"void uv__finish_close(uv_handle_t *)");
    }
    if ((uVar5 & 2) != 0) {
      __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                    ,0x10f,"void uv__finish_close(uv_handle_t *)");
    }
    puVar3 = (uv_stream_t *)stream->next_closing;
    stream->flags = uVar5 | 2;
    switch(stream->type) {
    case UV_ASYNC:
    case UV_CHECK:
    case UV_FS_EVENT:
    case UV_FS_POLL:
    case UV_IDLE:
    case UV_POLL:
    case UV_PREPARE:
    case UV_PROCESS:
    case UV_TIMER:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                    ,0x137,"void uv__finish_close(uv_handle_t *)");
    case UV_NAMED_PIPE:
    case UV_TCP:
    case UV_TTY:
      uv__stream_destroy(stream);
      break;
    case UV_UDP:
      uv__udp_finish_close((uv_udp_t *)stream);
      break;
    case UV_SIGNAL:
      if (*(uint *)(stream->io_watcher).pending_queue <=
          *(uint *)((long)(stream->io_watcher).pending_queue + 4)) break;
      stream->flags = uVar5;
      uv__make_close_pending((uv_handle_t *)stream);
      goto LAB_00112233;
    }
    uVar5 = stream->flags;
    if (((uVar5 & 8) != 0) && (stream->flags = uVar5 & 0xfffffff7, (uVar5 & 5) == 4)) {
      puVar2 = &stream->loop->active_handles;
      *puVar2 = *puVar2 - 1;
    }
    *(void **)stream->handle_queue[1] = stream->handle_queue[0];
    *(void **)((long)stream->handle_queue[0] + 8) = stream->handle_queue[1];
    if (stream->close_cb != (uv_close_cb)0x0) {
      (*stream->close_cb)((uv_handle_t *)stream);
    }
    goto LAB_00112233;
  }
  uVar5 = 1;
  goto LAB_00112361;
LAB_001122f7:
  if (mode == UV_RUN_ONCE) {
    uVar6 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar6 / 1000000;
    uv__run_timers(loop);
  }
  uVar5 = 1;
  if (((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) &&
     (ppvVar1 == (void **)*ppvVar1)) {
    uVar5 = (uint)(loop->closing_handles != (uv_handle_t *)0x0);
  }
  if ((0xfffffffd < mode + ~UV_RUN_NOWAIT) || (uVar5 == 0)) goto LAB_00112361;
  goto LAB_0011216b;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int can_sleep;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);

    can_sleep =
        QUEUE_EMPTY(&loop->pending_queue) && QUEUE_EMPTY(&loop->idle_handles);

    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && can_sleep) || mode == UV_RUN_DEFAULT)
      timeout = uv__backend_timeout(loop);

    uv__io_poll(loop, timeout);

    /* Process immediate callbacks (e.g. write_cb) a small fixed number of
     * times to avoid loop starvation.*/
    for (r = 0; r < 8 && !QUEUE_EMPTY(&loop->pending_queue); r++)
      uv__run_pending(loop);

    /* Run one final update on the provider_idle_time in case uv__io_poll
     * returned because the timeout expired, but no events were received. This
     * call will be ignored if the provider_entry_time was either never set (if
     * the timeout == 0) or was already updated b/c an event was received.
     */
    uv__metrics_update_idle_time(loop);

    uv__run_check(loop);
    uv__run_closing_handles(loop);

    if (mode == UV_RUN_ONCE) {
      /* UV_RUN_ONCE implies forward progress: at least one callback must have
       * been invoked when it returns. uv__io_poll() can return without doing
       * I/O (meaning: no callbacks) when its timeout expires - which means we
       * have pending timers that satisfy the forward progress constraint.
       *
       * UV_RUN_NOWAIT makes no guarantees about progress so it's omitted from
       * the check.
       */
      uv__update_time(loop);
      uv__run_timers(loop);
    }

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}